

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

void __thiscall AbstractModuleClient::initializeStreams(AbstractModuleClient *this)

{
  MlmWrap::subscribeStream(&this->super_MlmWrap,"Trodes","cmd");
  MlmWrap::subscribeStream(&this->super_MlmWrap,"Trodes","network_note");
  MlmWrap::setProducer(&this->super_MlmWrap,(this->super_MlmWrap).id._M_dataplus._M_p);
  this->timestampsub = (zsock_t *)0x0;
  return;
}

Assistant:

void AbstractModuleClient::initializeStreams(){
    //set the module as a subscriber to the general trodes commands stream
    try{
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_CMD);
        this->subscribeStream(TRODES_NETWORK_ID, TRODES_NETWORK_NOTIFICATION);
    } catch(std::string &e){
        std::cout << e << std::endl;
    }

    //initialize module data stream
    try{
        this->setProducer(this->id.c_str());
    } catch(std::string &e){
        std::cout << e << std::endl;
    }
    timestampsub = NULL;
}